

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::Action::~Action(Action *this)

{
  pointer pcVar1;
  
  this->_vptr_Action = (_func_int **)&PTR__Action_001e3b68;
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  Var::~Var(&this->module_var);
  return;
}

Assistant:

virtual ~Action() = default;